

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompNumber(xmlXPathParserContextPtr ctxt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  xmlXPathObjectPtr obj;
  double dVar5;
  undefined1 auVar6 [16];
  double local_58;
  double fraction;
  int local_48;
  int max;
  int frac;
  int v;
  double temp;
  unsigned_long tmp;
  xmlXPathObjectPtr num;
  int local_20;
  int is_exponent_negative;
  int exponent;
  int ok;
  double ret;
  xmlXPathParserContextPtr ctxt_local;
  
  bVar1 = false;
  local_20 = 0;
  bVar3 = false;
  if (ctxt->error == 0) {
    if ((*ctxt->cur == '.') || ((0x2f < *ctxt->cur && (*ctxt->cur < 0x3a)))) {
      _exponent = 0.0;
      while( true ) {
        bVar2 = false;
        if (0x2f < *ctxt->cur) {
          bVar2 = *ctxt->cur < 0x3a;
        }
        if (!bVar2) break;
        iVar4 = *ctxt->cur - 0x30;
        bVar1 = true;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        auVar6._8_4_ = iVar4 >> 0x1f;
        auVar6._0_8_ = (long)iVar4;
        auVar6._12_4_ = 0x45300000;
        _exponent = _exponent * 10.0 +
                    (auVar6._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0);
      }
      if (*ctxt->cur == '.') {
        local_48 = 0;
        local_58 = 0.0;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        if (((*ctxt->cur < 0x30) || (0x39 < *ctxt->cur)) && (!bVar1)) {
          xmlXPathErr(ctxt,1);
          return;
        }
        while (*ctxt->cur == '0') {
          local_48 = local_48 + 1;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        iVar4 = local_48 + 0x14;
        while( true ) {
          bVar1 = false;
          if ((0x2f < *ctxt->cur) && (bVar1 = false, *ctxt->cur < 0x3a)) {
            bVar1 = local_48 < iVar4;
          }
          if (!bVar1) break;
          local_58 = local_58 * 10.0 + (double)(int)(*ctxt->cur - 0x30);
          local_48 = local_48 + 1;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        dVar5 = pow(10.0,(double)local_48);
        _exponent = _exponent + local_58 / dVar5;
        while( true ) {
          bVar1 = false;
          if (0x2f < *ctxt->cur) {
            bVar1 = *ctxt->cur < 0x3a;
          }
          if (!bVar1) break;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
      }
      if ((*ctxt->cur == 'e') || (*ctxt->cur == 'E')) {
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
        if (*ctxt->cur == '-') {
          bVar3 = true;
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        else if ((*ctxt->cur == '+') && (*ctxt->cur != '\0')) {
          ctxt->cur = ctxt->cur + 1;
        }
        while( true ) {
          bVar1 = false;
          if (0x2f < *ctxt->cur) {
            bVar1 = *ctxt->cur < 0x3a;
          }
          if (!bVar1) break;
          if (local_20 < 1000000) {
            local_20 = local_20 * 10 + (*ctxt->cur - 0x30);
          }
          if (*ctxt->cur != '\0') {
            ctxt->cur = ctxt->cur + 1;
          }
        }
        if (bVar3) {
          local_20 = -local_20;
        }
        dVar5 = pow(10.0,(double)local_20);
        _exponent = dVar5 * _exponent;
      }
      obj = xmlXPathCacheNewFloat(ctxt->context,_exponent);
      if (obj == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar4 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,obj,(void *)0x0);
        if (iVar4 == -1) {
          xmlXPathReleaseObject(ctxt->context,obj);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,1);
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompNumber(xmlXPathParserContextPtr ctxt)
{
    double ret = 0.0;
    int ok = 0;
    int exponent = 0;
    int is_exponent_negative = 0;
    xmlXPathObjectPtr num;
#ifdef __GNUC__
    unsigned long tmp = 0;
    double temp;
#endif

    CHECK_ERROR;
    if ((CUR != '.') && ((CUR < '0') || (CUR > '9'))) {
        XP_ERROR(XPATH_NUMBER_ERROR);
    }
#ifdef __GNUC__
    /*
     * tmp/temp is a workaround against a gcc compiler bug
     * http://veillard.com/gcc.bug
     */
    ret = 0;
    while ((CUR >= '0') && (CUR <= '9')) {
	ret = ret * 10;
	tmp = (CUR - '0');
        ok = 1;
        NEXT;
	temp = (double) tmp;
	ret = ret + temp;
    }
#else
    ret = 0;
    while ((CUR >= '0') && (CUR <= '9')) {
	ret = ret * 10 + (CUR - '0');
	ok = 1;
	NEXT;
    }
#endif
    if (CUR == '.') {
	int v, frac = 0, max;
	double fraction = 0;

        NEXT;
        if (((CUR < '0') || (CUR > '9')) && (!ok)) {
            XP_ERROR(XPATH_NUMBER_ERROR);
        }
        while (CUR == '0') {
            frac = frac + 1;
            NEXT;
        }
        max = frac + MAX_FRAC;
        while ((CUR >= '0') && (CUR <= '9') && (frac < max)) {
	    v = (CUR - '0');
	    fraction = fraction * 10 + v;
	    frac = frac + 1;
            NEXT;
        }
        fraction /= pow(10.0, frac);
        ret = ret + fraction;
        while ((CUR >= '0') && (CUR <= '9'))
            NEXT;
    }
    if ((CUR == 'e') || (CUR == 'E')) {
        NEXT;
        if (CUR == '-') {
            is_exponent_negative = 1;
            NEXT;
        } else if (CUR == '+') {
	    NEXT;
	}
        while ((CUR >= '0') && (CUR <= '9')) {
            if (exponent < 1000000)
                exponent = exponent * 10 + (CUR - '0');
            NEXT;
        }
        if (is_exponent_negative)
            exponent = -exponent;
        ret *= pow(10.0, (double) exponent);
    }
    num = xmlXPathCacheNewFloat(ctxt->context, ret);
    if (num == NULL) {
	ctxt->error = XPATH_MEMORY_ERROR;
    } else if (PUSH_LONG_EXPR(XPATH_OP_VALUE, XPATH_NUMBER, 0, 0, num,
                              NULL) == -1) {
        xmlXPathReleaseObject(ctxt->context, num);
    }
}